

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O3

TPM_HANDLE
TSS_CreatePersistentKey
          (TSS_DEVICE *tpm_device,TPM_HANDLE request_handle,TSS_SESSION *sess,
          TPMI_DH_OBJECT hierarchy,TPM2B_PUBLIC *inPub,TPM2B_PUBLIC *outPub)

{
  TPM_RC TVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  TPM_HANDLE result;
  TPML_PCR_SELECTION creationPCR;
  TPM2B_DATA outsideInfo;
  TPM2B_NAME qName;
  TPM2B_NAME name;
  TPM2B_SENSITIVE_CREATE sensCreate;
  undefined8 in_stack_ffffffffffffce78;
  TPML_PCR_SELECTION *creationPCR_00;
  undefined8 uVar5;
  undefined4 uVar6;
  TSS_CMD_CONTEXT *cmdCtx;
  TPMI_DH_OBJECT local_3154;
  TPM2B_PUBLIC *local_3150;
  TPML_PCR_SELECTION local_3148;
  TPM2B_DATA local_3128;
  TPM2B_NAME local_30dc;
  TPM2B_NAME local_3096;
  TSS_CMD_CONTEXT local_3050;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffce78 >> 0x20);
  local_3150 = inPub;
  TVar1 = TPM2_ReadPublic(tpm_device,request_handle,outPub,&local_3096,&local_30dc);
  if (TVar1 == 0) {
    return request_handle;
  }
  if (TVar1 == 0x8b) {
    memset(&local_3050,0,0xca);
    local_3128._48_8_ = 0;
    local_3128._56_8_ = 0;
    local_3128._32_8_ = 0;
    local_3128._40_8_ = 0;
    local_3128._16_8_ = 0;
    local_3128._24_8_ = 0;
    local_3128._0_8_ = 0;
    local_3128._8_8_ = 0;
    local_3128._64_4_ = 0;
    creationPCR_00 = &local_3148;
    local_3148.pcrSelections[2].hash = 0;
    local_3148.pcrSelections[2].sizeofSelect = '\0';
    local_3148.pcrSelections[2].pcrSelect[0] = '\0';
    local_3148.pcrSelections[2].pcrSelect[1] = '\0';
    local_3148.pcrSelections[2].pcrSelect[2] = '\0';
    local_3148.pcrSelections[3].hash = 0;
    local_3148.pcrSelections[3].sizeofSelect = '\0';
    local_3148.pcrSelections[3].pcrSelect[0] = '\0';
    local_3148.pcrSelections[3].pcrSelect[1] = '\0';
    local_3148.pcrSelections[3].pcrSelect[2] = '\0';
    local_3148.count = 0;
    local_3148.pcrSelections[0].hash = 0;
    local_3148.pcrSelections[0].sizeofSelect = '\0';
    local_3148.pcrSelections[0].pcrSelect[0] = '\0';
    local_3148.pcrSelections[0].pcrSelect[1] = '\0';
    local_3148.pcrSelections[0].pcrSelect[2] = '\0';
    local_3148.pcrSelections[1].hash = 0;
    local_3148.pcrSelections[1].sizeofSelect = '\0';
    local_3148.pcrSelections[1].pcrSelect[0] = '\0';
    local_3148.pcrSelections[1].pcrSelect[1] = '\0';
    local_3148.pcrSelections[1].pcrSelect[2] = '\0';
    cmdCtx = &local_3050;
    TVar1 = TPM2_CreatePrimary(tpm_device,sess,hierarchy,(TPM2B_SENSITIVE_CREATE *)cmdCtx,local_3150
                               ,&local_3128,creationPCR_00,&local_3154,outPub,
                               (TPM2B_CREATION_DATA *)0x0,(TPM2B_DIGEST *)0x0,
                               (TPMT_TK_CREATION *)0x0);
    uVar6 = (undefined4)((ulong)creationPCR_00 >> 0x20);
    if (TVar1 == 0) {
      TVar1 = TPM2_EvictControl(tpm_device,sess,0x40000001,local_3154,request_handle);
      if (TVar1 == 0) {
        local_3128.b = (TPM2B)local_3154;
        local_3050.ParamSize = 0;
        TVar1 = TSS_DispatchCmd(tpm_device,0x165,(TPM_HANDLE *)&local_3128.b,1,(TSS_SESSION **)0x0,0
                                ,cmdCtx);
        uVar6 = (undefined4)((ulong)cmdCtx >> 0x20);
        if (TVar1 == 0) {
          return request_handle;
        }
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return 0;
        }
        uVar5 = CONCAT44(uVar6,TVar1);
        pcVar4 = "Failed calling TPM2_FlushContext 0x%x";
        iVar3 = 0xea;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return 0;
        }
        uVar5 = CONCAT44(uVar6,TVar1);
        pcVar4 = "Failed calling TPM2_EvictControl 0x%x";
        iVar3 = 0xe5;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 0;
      }
      uVar5 = CONCAT44(uVar6,TVar1);
      pcVar4 = "Failed calling TSS_CreatePrimary 0x%x";
      iVar3 = 0xde;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0;
    }
    uVar5 = CONCAT44(uVar6,TVar1);
    pcVar4 = "Failed calling TPM2_ReadPublic 0x%x";
    iVar3 = 0xd7;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
            ,"TSS_CreatePersistentKey",iVar3,1,pcVar4,uVar5);
  return 0;
}

Assistant:

TPM_HANDLE TSS_CreatePersistentKey(TSS_DEVICE* tpm_device, TPM_HANDLE request_handle, TSS_SESSION* sess, TPMI_DH_OBJECT hierarchy, TPM2B_PUBLIC* inPub, TPM2B_PUBLIC* outPub)
{
    TPM_HANDLE result;
    TPM_RC tpm_result;
    TPM2B_NAME name;
    TPM2B_NAME qName;

    tpm_result = TPM2_ReadPublic(tpm_device, request_handle, outPub, &name, &qName);
    if (tpm_result == TPM_RC_SUCCESS)
    {
        result = request_handle;
    }
    else if (tpm_result != TPM_RC_HANDLE)
    {
        LogError("Failed calling TPM2_ReadPublic 0x%x", tpm_result);
        result = 0;
    }
    else
    {
        if ((tpm_result = TSS_CreatePrimary(tpm_device, sess, hierarchy, inPub, &result, outPub)) != TPM_RC_SUCCESS)
        {
            LogError("Failed calling TSS_CreatePrimary 0x%x", tpm_result);
            result = 0;
        }
        else
        {
            if ((tpm_result = TPM2_EvictControl(tpm_device, sess, TPM_RH_OWNER, result, request_handle)) != TPM_RC_SUCCESS)
            {
                LogError("Failed calling TPM2_EvictControl 0x%x", tpm_result);
                result = 0;
            }
            else if ((tpm_result = TPM2_FlushContext(tpm_device, result)) != TPM_RC_SUCCESS)
            {
                LogError("Failed calling TPM2_FlushContext 0x%x", tpm_result);
                result = 0;
            }
            else
            {
                result = request_handle;
            }
        }
    }
    return result;
}